

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToolsTest.cc
# Opt level: O3

int main(int param_1,char **param_2)

{
  uint uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long *plVar9;
  long *plVar10;
  void *pvVar11;
  uint64_t target_value;
  CallOnDestroy g1;
  bool called;
  uint64_t target_value3;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
  *in_stack_fffffffffffffd00;
  _Any_data local_2f8;
  code *local_2e8;
  code *local_2e0;
  _Any_data local_2c0;
  long local_2b0;
  value_type local_2a0;
  ulong local_298;
  ulong local_290;
  value_type *local_288;
  undefined8 local_280;
  code *local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  code *local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  code *local_238;
  undefined8 uStack_230;
  _Any_data local_228;
  code *local_218;
  undefined8 uStack_210;
  _Any_data local_208;
  code *local_1f8;
  undefined8 uStack_1f0;
  _Any_data local_1e8;
  code *local_1d8;
  undefined8 uStack_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  undefined8 uStack_1b0;
  _Any_data local_1a8;
  code *local_198;
  undefined8 uStack_190;
  _Any_data local_188;
  code *local_178;
  undefined8 uStack_170;
  long *local_168;
  undefined8 local_160;
  code *local_158;
  code *local_150;
  _Any_data *local_148;
  undefined8 local_140;
  code *local_138;
  code *local_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  puts("-- on_close_scope");
  local_2f8._M_unused._M_object = &local_2a0;
  local_2a0 = local_2a0 & 0xffffffffffffff00;
  local_280 = 0;
  local_2e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:14:32)>
              ::_M_invoke;
  local_2f8._8_8_ = 0;
  local_2e8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:14:32)>
              ::_M_manager;
  local_278 = (code *)0x0;
  uStack_270 = 0;
  local_288 = (value_type *)local_2f8._M_unused._0_8_;
  phosg::CallOnDestroy::CallOnDestroy((CallOnDestroy *)&local_2c0,(function<void_()> *)&local_2f8);
  if (local_2e8 != (code *)0x0) {
    (*local_2e8)(&local_2f8,&local_2f8,3);
  }
  if (local_278 != (code *)0x0) {
    (*local_278)(&local_288,&local_288,3);
  }
  phosg::expect_generic
            ((bool)((byte)local_2a0 ^ 1),"!(!called)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x11);
  phosg::CallOnDestroy::~CallOnDestroy((CallOnDestroy *)&local_2c0);
  phosg::expect_generic
            ((bool)(byte)local_2a0,"!(called)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x13);
  uVar1 = std::thread::hardware_concurrency();
  puts("-- parallel_range");
  local_2f8._M_unused._M_object = (void *)0x0;
  local_2f8._8_8_ = 0;
  local_2e8 = (code *)0x0;
  local_2f8._M_unused._M_object = operator_new(0x1000000);
  pvVar11 = (void *)((long)local_2f8._M_unused._0_8_ + 0x1000000);
  local_2e8 = (code *)pvVar11;
  memset(local_2f8._M_unused._M_object,0,0x1000000);
  local_2f8._8_8_ = pvVar11;
  uVar2 = phosg::now();
  uVar6 = (ulong)uVar1;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:27:25)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:27:25)>
             ::_M_manager;
  local_188._M_unused._M_object = (void *)0x0;
  local_188._8_8_ = 0;
  local_178 = (code *)0x0;
  uStack_170 = 0;
  local_88._M_unused._M_object = &local_2f8;
  phosg::parallel_range<unsigned_long>
            ((function<bool_(unsigned_long,_unsigned_long)> *)&local_88,0,
             local_2f8._8_8_ - local_2f8._0_8_,uVar6,
             (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &local_188);
  if (local_178 != (code *)0x0) {
    (*local_178)(&local_188,&local_188,__destroy_functor);
  }
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  uVar3 = phosg::now();
  fprintf(_stderr,"---- time: %lu\n",uVar3 - uVar2);
  local_2a0 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2c0,uVar6,&local_2a0,
             (allocator_type *)&local_298);
  uVar5 = local_2f8._8_8_;
  if ((void *)local_2f8._8_8_ != local_2f8._M_unused._M_object) {
    uVar8 = 0;
    do {
      phosg::expect_generic
                (*(char *)((long)local_2f8._M_unused._0_8_ + uVar8) != '\0',"hits[x] == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
                 ,0x26);
      if ((ulong)((long)(local_2c0._8_8_ - local_2c0._0_8_) >> 3) <=
          (ulong)*(byte *)((long)local_2f8._M_unused._0_8_ + uVar8) - 1) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      plVar9 = (long *)((long)local_2c0._M_unused._0_8_ +
                       (ulong)*(byte *)((long)local_2f8._M_unused._0_8_ + uVar8) * 8 + -8);
      *plVar9 = *plVar9 + 1;
      uVar8 = uVar8 + 1;
      uVar5 = local_2f8._M_unused._0_8_;
    } while (uVar8 < (ulong)(local_2f8._8_8_ - local_2f8._0_8_));
  }
  local_290 = uVar6;
  if ((void *)local_2c0._8_8_ == local_2c0._M_unused._M_object) {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    uVar6 = 0;
    do {
      phosg::expect_generic
                (*(long *)((long)local_2c0._M_unused._0_8_ + uVar6 * 8) != 0,"thread_counts[x] == 0"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
                 ,0x2c);
      fprintf(_stderr,"---- thread %zu: %zu\n",uVar6,
              *(undefined8 *)((long)local_2c0._M_unused._0_8_ + uVar6 * 8));
      lVar7 = lVar7 + *(long *)((long)local_2c0._M_unused._0_8_ + uVar6 * 8);
      uVar6 = uVar6 + 1;
      uVar5 = local_2f8._M_unused._0_8_;
    } while (uVar6 < (ulong)((long)(local_2c0._8_8_ - local_2c0._0_8_) >> 3));
  }
  uVar6 = local_290;
  phosg::expect_generic
            (lVar7 == local_2f8._8_8_ - uVar5,"sum != hits.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x30);
  if (local_2c0._M_unused._M_object != (void *)0x0) {
    operator_delete(local_2c0._M_unused._M_object,local_2b0 - local_2c0._0_8_);
  }
  if (local_2f8._M_unused._M_object != (void *)0x0) {
    operator_delete(local_2f8._M_unused._M_object,(long)local_2e8 - local_2f8._0_8_);
  }
  puts("-- parallel_range return value");
  local_2f8._M_unused._M_object = (void *)0xc349;
  local_a8._8_8_ = 0;
  local_90 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:54:21)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:54:21)>
             ::_M_manager;
  local_1a8._M_unused._M_object = (void *)0x0;
  local_1a8._8_8_ = 0;
  local_198 = (code *)0x0;
  uStack_190 = 0;
  local_a8._M_unused._M_object = &local_2f8;
  pvVar11 = (void *)phosg::parallel_range<unsigned_long>
                              ((function<bool_(unsigned_long,_unsigned_long)> *)&local_a8,0,0x10000,
                               uVar6,(function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
                                      *)&local_1a8);
  phosg::expect_generic
            (pvVar11 == local_2f8._M_unused._M_object,
             "(parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)) != target_value"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x39);
  if (local_198 != (code *)0x0) {
    (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  local_2f8._M_unused._M_object = (void *)0xcc349;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:54:21)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:54:21)>
             ::_M_manager;
  local_1c8._M_unused._M_object = (void *)0x0;
  local_1c8._8_8_ = 0;
  local_1b8 = (code *)0x0;
  uStack_1b0 = 0;
  local_c8._M_unused._M_object = &local_2f8;
  uVar4 = phosg::parallel_range<unsigned_long>
                    ((function<bool_(unsigned_long,_unsigned_long)> *)&local_c8,0,0x10000,uVar6,
                     (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                     &local_1c8);
  phosg::expect_generic
            (uVar4 == 0x10000,
             "(parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)) != 0x10000",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x40);
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  puts("-- parallel_range_blocks");
  local_2f8._M_unused._M_object = (void *)0x0;
  local_2f8._8_8_ = 0;
  local_2e8 = (code *)0x0;
  local_2f8._M_unused._M_object = operator_new(0x1000000);
  pvVar11 = (void *)((long)local_2f8._M_unused._0_8_ + 0x1000000);
  local_2e8 = (code *)pvVar11;
  memset(local_2f8._M_unused._M_object,0,0x1000000);
  local_2f8._8_8_ = pvVar11;
  uVar2 = phosg::now();
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:70:25)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:70:25)>
             ::_M_manager;
  local_1e8._M_unused._M_object = (void *)0x0;
  local_1e8._8_8_ = 0;
  local_1d8 = (code *)0x0;
  uStack_1d0 = 0;
  local_e8._M_unused._M_object = &local_2f8;
  phosg::parallel_range_blocks<unsigned_long>
            ((function<bool_(unsigned_long,_unsigned_long)> *)&local_e8,0,
             local_2f8._8_8_ - local_2f8._0_8_,0x1000,uVar6,
             (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &local_1e8);
  if (local_1d8 != (code *)0x0) {
    (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  uVar3 = phosg::now();
  fprintf(_stderr,"---- time: %lu\n",uVar3 - uVar2);
  local_2a0 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2c0,uVar6,&local_2a0,
             (allocator_type *)&local_298);
  uVar5 = local_2f8._8_8_;
  if ((void *)local_2f8._8_8_ != local_2f8._M_unused._M_object) {
    uVar8 = 0;
    do {
      phosg::expect_generic
                (*(char *)((long)local_2f8._M_unused._0_8_ + uVar8) != '\0',"hits[x] == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
                 ,0x51);
      if ((ulong)((long)(local_2c0._8_8_ - local_2c0._0_8_) >> 3) <=
          (ulong)*(byte *)((long)local_2f8._M_unused._0_8_ + uVar8) - 1) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      plVar9 = (long *)((long)local_2c0._M_unused._0_8_ +
                       (ulong)*(byte *)((long)local_2f8._M_unused._0_8_ + uVar8) * 8 + -8);
      *plVar9 = *plVar9 + 1;
      uVar8 = uVar8 + 1;
      uVar5 = local_2f8._M_unused._0_8_;
    } while (uVar8 < (ulong)(local_2f8._8_8_ - local_2f8._0_8_));
  }
  if ((void *)local_2c0._8_8_ == local_2c0._M_unused._M_object) {
    lVar7 = 0;
  }
  else {
    uVar8 = 0;
    lVar7 = 0;
    do {
      phosg::expect_generic
                (*(long *)((long)local_2c0._M_unused._0_8_ + uVar8 * 8) != 0,"thread_counts[x] == 0"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
                 ,0x57);
      fprintf(_stderr,"---- thread %zu: %zu\n",uVar8,
              *(undefined8 *)((long)local_2c0._M_unused._0_8_ + uVar8 * 8));
      lVar7 = lVar7 + *(long *)((long)local_2c0._M_unused._0_8_ + uVar8 * 8);
      uVar8 = uVar8 + 1;
      uVar5 = local_2f8._M_unused._0_8_;
      uVar6 = local_290;
    } while (uVar8 < (ulong)((long)(local_2c0._8_8_ - local_2c0._0_8_) >> 3));
  }
  phosg::expect_generic
            (lVar7 == local_2f8._8_8_ - uVar5,"sum != hits.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x5b);
  if (local_2c0._M_unused._M_object != (void *)0x0) {
    operator_delete(local_2c0._M_unused._M_object,local_2b0 - local_2c0._0_8_);
  }
  if (local_2f8._M_unused._M_object != (void *)0x0) {
    operator_delete(local_2f8._M_unused._M_object,(long)local_2e8 - local_2f8._0_8_);
  }
  puts("-- parallel_range_blocks return value");
  local_2f8._M_unused._M_object = (void *)0xc349;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:97:21)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:97:21)>
             ::_M_manager;
  local_208._M_unused._M_object = (void *)0x0;
  local_208._8_8_ = 0;
  local_1f8 = (code *)0x0;
  uStack_1f0 = 0;
  local_108._M_unused._M_object = &local_2f8;
  pvVar11 = (void *)phosg::parallel_range_blocks<unsigned_long>
                              ((function<bool_(unsigned_long,_unsigned_long)> *)&local_108,0,
                               0x100000,0x1000,uVar6,
                               (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
                                *)&local_208);
  phosg::expect_generic
            (pvVar11 == local_2f8._M_unused._M_object,
             "(parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)) != target_value"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,100);
  if (local_1f8 != (code *)0x0) {
    (*local_1f8)(&local_208,&local_208,__destroy_functor);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  local_2f8._M_unused._M_object = (void *)0xccc349;
  local_128._8_8_ = 0;
  local_110 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:97:21)>
              ::_M_invoke;
  local_118 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:97:21)>
              ::_M_manager;
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  local_218 = (code *)0x0;
  uStack_210 = 0;
  local_128._M_unused._M_object = &local_2f8;
  uVar4 = phosg::parallel_range_blocks<unsigned_long>
                    ((function<bool_(unsigned_long,_unsigned_long)> *)&local_128,0,0x100000,0x1000,
                     uVar6,(function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
                            *)&local_228);
  phosg::expect_generic
            (uVar4 == 0x100000,
             "(parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)) != 0x100000"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x6b);
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,__destroy_functor);
  }
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  puts("-- parallel_range_blocks_multi");
  local_2f8._M_unused._M_object = (void *)0x0;
  local_2f8._8_8_ = 0;
  local_2e8 = (code *)0x0;
  local_2f8._M_unused._M_object = operator_new(0x1000000);
  pvVar11 = (void *)((long)local_2f8._M_unused._0_8_ + 0x1000000);
  local_2e8 = (code *)pvVar11;
  memset(local_2f8._M_unused._M_object,0,0x1000000);
  local_2f8._8_8_ = pvVar11;
  uVar2 = phosg::now();
  local_140 = 0;
  local_130 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:113:25)>
              ::_M_invoke;
  local_138 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:113:25)>
              ::_M_manager;
  local_248 = 0;
  uStack_240 = 0;
  local_238 = (code *)0x0;
  uStack_230 = 0;
  local_148 = &local_2f8;
  phosg::
  parallel_range_blocks_multi<unsigned_long,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)&local_68,(phosg *)&local_148,(function<bool_(unsigned_long,_unsigned_long)> *)0x0,
             local_2f8._8_8_ - local_2f8._0_8_,0x1000,uVar6,(size_t)&local_248,
             in_stack_fffffffffffffd00);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  if (local_238 != (code *)0x0) {
    (*local_238)(&local_248,&local_248,3);
  }
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,3);
  }
  uVar3 = phosg::now();
  fprintf(_stderr,"---- time: %lu\n",uVar3 - uVar2);
  local_2a0 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_2c0,uVar6,&local_2a0,
             (allocator_type *)&local_298);
  uVar5 = local_2f8._8_8_;
  if ((void *)local_2f8._8_8_ != local_2f8._M_unused._M_object) {
    uVar6 = 0;
    do {
      phosg::expect_generic
                (*(char *)((long)local_2f8._M_unused._0_8_ + uVar6) != '\0',"hits[x] == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
                 ,0x7c);
      if ((ulong)((long)(local_2c0._8_8_ - local_2c0._0_8_) >> 3) <=
          (ulong)*(byte *)((long)local_2f8._M_unused._0_8_ + uVar6) - 1) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      plVar9 = (long *)((long)local_2c0._M_unused._0_8_ +
                       (ulong)*(byte *)((long)local_2f8._M_unused._0_8_ + uVar6) * 8 + -8);
      *plVar9 = *plVar9 + 1;
      uVar6 = uVar6 + 1;
      uVar5 = local_2f8._M_unused._0_8_;
    } while (uVar6 < (ulong)(local_2f8._8_8_ - local_2f8._0_8_));
  }
  if ((void *)local_2c0._8_8_ == local_2c0._M_unused._M_object) {
    lVar7 = 0;
  }
  else {
    uVar6 = 0;
    lVar7 = 0;
    do {
      phosg::expect_generic
                (*(long *)((long)local_2c0._M_unused._0_8_ + uVar6 * 8) != 0,"thread_counts[x] == 0"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
                 ,0x82);
      fprintf(_stderr,"---- thread %zu: %zu\n",uVar6,
              *(undefined8 *)((long)local_2c0._M_unused._0_8_ + uVar6 * 8));
      lVar7 = lVar7 + *(long *)((long)local_2c0._M_unused._0_8_ + uVar6 * 8);
      uVar6 = uVar6 + 1;
      uVar5 = local_2f8._M_unused._0_8_;
    } while (uVar6 < (ulong)((long)(local_2c0._8_8_ - local_2c0._0_8_) >> 3));
  }
  phosg::expect_generic
            (lVar7 == local_2f8._8_8_ - uVar5,"sum != hits.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x86);
  uVar6 = local_290;
  if (local_2c0._M_unused._M_object != (void *)0x0) {
    operator_delete(local_2c0._M_unused._M_object,local_2b0 - local_2c0._0_8_);
  }
  if (local_2f8._M_unused._M_object != (void *)0x0) {
    operator_delete(local_2f8._M_unused._M_object,(long)local_2e8 - local_2f8._0_8_);
  }
  puts("-- parallel_range_blocks_multi return value");
  local_2c0._M_unused._M_object = (void *)0xc349;
  local_2a0 = 0x53a0;
  local_298 = 0x34d;
  local_160 = 0;
  local_168 = (long *)operator_new(0x18);
  *local_168 = (long)&local_2c0;
  local_168[1] = (long)&local_2a0;
  local_168[2] = (long)&local_298;
  local_150 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:142:21)>
              ::_M_invoke;
  local_158 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:142:21)>
              ::_M_manager;
  local_258 = (code *)0x0;
  uStack_250 = 0;
  local_268 = 0;
  uStack_260 = 0;
  phosg::
  parallel_range_blocks_multi<unsigned_long,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)&local_2f8,(phosg *)&local_168,(function<bool_(unsigned_long,_unsigned_long)> *)0x0,
             0x100000,0x1000,uVar6,(size_t)&local_268,in_stack_fffffffffffffd00);
  if (local_258 != (code *)0x0) {
    (*local_258)(&local_268,&local_268,3);
  }
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,3);
  }
  phosg::expect_generic
            (local_2e0 == (code *)0x3,"3 != found.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x92);
  plVar9 = *(long **)((long)local_2f8._M_unused._0_8_ +
                     (local_2c0._M_unused._M_member_pointer % (ulong)local_2f8._8_8_) * 8);
  plVar10 = (long *)0x0;
  if ((plVar9 != (long *)0x0) &&
     (plVar9 = (long *)*plVar9, plVar10 = plVar9, local_2c0._M_unused._M_object != (void *)plVar9[1]
     )) {
    while (plVar9 = (long *)*plVar9, plVar9 != (long *)0x0) {
      plVar10 = (long *)0x0;
      if (((ulong)plVar9[1] % (ulong)local_2f8._8_8_ !=
           local_2c0._M_unused._M_member_pointer % (ulong)local_2f8._8_8_) ||
         (plVar10 = plVar9, local_2c0._M_unused._M_object == (void *)plVar9[1])) goto LAB_0010698c;
    }
    plVar10 = (long *)0x0;
  }
LAB_0010698c:
  phosg::expect_generic
            (plVar10 != (long *)0x0,"!(found.count(target_value1))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x93);
  plVar9 = *(long **)((long)local_2f8._M_unused._0_8_ + (local_2a0 % (ulong)local_2f8._8_8_) * 8);
  plVar10 = (long *)0x0;
  if ((plVar9 != (long *)0x0) &&
     (plVar9 = (long *)*plVar9, plVar10 = plVar9, local_2a0 != plVar9[1])) {
    while (plVar9 = (long *)*plVar9, plVar9 != (long *)0x0) {
      plVar10 = (long *)0x0;
      if (((ulong)plVar9[1] % (ulong)local_2f8._8_8_ != local_2a0 % (ulong)local_2f8._8_8_) ||
         (plVar10 = plVar9, local_2a0 == plVar9[1])) goto LAB_00106a0d;
    }
    plVar10 = (long *)0x0;
  }
LAB_00106a0d:
  phosg::expect_generic
            (plVar10 != (long *)0x0,"!(found.count(target_value2))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x94);
  plVar9 = *(long **)((long)local_2f8._M_unused._0_8_ + (local_298 % (ulong)local_2f8._8_8_) * 8);
  plVar10 = (long *)0x0;
  if ((plVar9 != (long *)0x0) &&
     (plVar9 = (long *)*plVar9, plVar10 = plVar9, local_298 != plVar9[1])) {
    while (plVar9 = (long *)*plVar9, plVar9 != (long *)0x0) {
      plVar10 = (long *)0x0;
      if (((ulong)plVar9[1] % (ulong)local_2f8._8_8_ != local_298 % (ulong)local_2f8._8_8_) ||
         (plVar10 = plVar9, local_298 == plVar9[1])) goto LAB_00106a8e;
    }
    plVar10 = (long *)0x0;
  }
LAB_00106a8e:
  phosg::expect_generic
            (plVar10 != (long *)0x0,"!(found.count(target_value3))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x95);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_2f8);
  puts("ToolsTest: all tests passed");
  return 0;
}

Assistant:

int main(int, char**) {
  {
    printf("-- on_close_scope\n");
    bool called = false;
    {
      auto g1 = on_close_scope([&]() {
        called = true;
      });
      expect(!called);
    }
    expect(called);
  }

  const size_t num_threads = thread::hardware_concurrency();

  {
    printf("-- parallel_range\n");
    vector<uint8_t> hits(0x1000000, 0);
    auto handle_value = [&](uint64_t v, size_t thread_num) -> bool {
      hits[v] = thread_num + 1;
      return false;
    };
    uint64_t start_time = now();
    parallel_range<uint64_t>(handle_value, 0, hits.size(), num_threads, nullptr);
    uint64_t duration = now() - start_time;
    fprintf(stderr, "---- time: %" PRIu64 "\n", duration);

    vector<size_t> thread_counts(num_threads, 0);
    for (size_t x = 0; x < hits.size(); x++) {
      expect_ne(hits[x], 0);
      thread_counts.at(hits[x] - 1)++;
    }

    size_t sum = 0;
    for (size_t x = 0; x < thread_counts.size(); x++) {
      expect_ne(thread_counts[x], 0);
      fprintf(stderr, "---- thread %zu: %zu\n", x, thread_counts[x]);
      sum += thread_counts[x];
    }
    expect_eq(sum, hits.size());
  }

  {
    printf("-- parallel_range return value\n");
    uint64_t target_value = 0xC349;
    auto is_equal = [&](uint64_t v, size_t) -> bool {
      return (v == target_value);
    };
    expect_eq((parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)), target_value);
    // Note: We can't check that parallel_range ends early when fn returns true
    // because it's not actually guaranteed to do so - it's only guaranteed to
    // return any of the values for which fn returns true. One could imagine a sequence of events in
    // which the target value's call takes a very long time, and all other threads
    // could finish checking all other values before the target one returns true.
    target_value = 0xCC349; // > end_value; should not be found
    expect_eq((parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)), 0x10000);
  }

  {
    printf("-- parallel_range_blocks\n");
    vector<uint8_t> hits(0x1000000, 0);
    auto handle_value = [&](uint64_t v, size_t thread_num) -> bool {
      hits[v] = thread_num + 1;
      return false;
    };
    uint64_t start_time = now();
    parallel_range_blocks<uint64_t>(handle_value, 0, hits.size(), 0x1000, num_threads, nullptr);
    uint64_t duration = now() - start_time;
    fprintf(stderr, "---- time: %" PRIu64 "\n", duration);

    vector<size_t> thread_counts(num_threads, 0);
    for (size_t x = 0; x < hits.size(); x++) {
      expect_ne(hits[x], 0);
      thread_counts.at(hits[x] - 1)++;
    }

    size_t sum = 0;
    for (size_t x = 0; x < thread_counts.size(); x++) {
      expect_ne(thread_counts[x], 0);
      fprintf(stderr, "---- thread %zu: %zu\n", x, thread_counts[x]);
      sum += thread_counts[x];
    }
    expect_eq(sum, hits.size());
  }

  {
    printf("-- parallel_range_blocks return value\n");
    uint64_t target_value = 0xC349;
    auto is_equal = [&](uint64_t v, size_t) -> bool {
      return (v == target_value);
    };
    expect_eq((parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)), target_value);
    // Note: We can't check that parallel_range ends early when fn returns true
    // because it's not actually guaranteed to do so - it's only guaranteed to
    // return any of the values for which fn returns true. One could imagine a sequence of events in
    // which the target value's call takes a very long time, and all other threads
    // could finish checking all other values before the target one returns true.
    target_value = 0xCCC349; // > end_value; should not be found
    expect_eq((parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)), 0x100000);
  }

  {
    printf("-- parallel_range_blocks_multi\n");
    vector<uint8_t> hits(0x1000000, 0);
    auto handle_value = [&](uint64_t v, size_t thread_num) -> bool {
      hits[v] = thread_num + 1;
      return false;
    };
    uint64_t start_time = now();
    parallel_range_blocks_multi<uint64_t>(handle_value, 0, hits.size(), 0x1000, num_threads, nullptr);
    uint64_t duration = now() - start_time;
    fprintf(stderr, "---- time: %" PRIu64 "\n", duration);

    vector<size_t> thread_counts(num_threads, 0);
    for (size_t x = 0; x < hits.size(); x++) {
      expect_ne(hits[x], 0);
      thread_counts.at(hits[x] - 1)++;
    }

    size_t sum = 0;
    for (size_t x = 0; x < thread_counts.size(); x++) {
      expect_ne(thread_counts[x], 0);
      fprintf(stderr, "---- thread %zu: %zu\n", x, thread_counts[x]);
      sum += thread_counts[x];
    }
    expect_eq(sum, hits.size());
  }

  {
    printf("-- parallel_range_blocks_multi return value\n");
    uint64_t target_value1 = 0xC349;
    uint64_t target_value2 = 0x53A0;
    uint64_t target_value3 = 0x034D;
    auto is_equal = [&](uint64_t v, size_t) -> bool {
      return ((v == target_value1) || (v == target_value2) || (v == target_value3));
    };
    auto found = parallel_range_blocks_multi<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr);
    expect_eq(3, found.size());
    expect(found.count(target_value1));
    expect(found.count(target_value2));
    expect(found.count(target_value3));
  }

  printf("ToolsTest: all tests passed\n");
  return 0;
}